

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSeparateShaderObjsTests.cpp
# Opt level: O0

void __thiscall
glcts::PipelineApiCase::checkProgInfoLog(PipelineApiCase *this,Functions *gl,GLuint pipeline)

{
  glGetProgramPipelineInfoLogFunc p_Var1;
  GLsizei GVar2;
  int iVar3;
  GLenum GVar4;
  GLuint GVar5;
  reference pvVar6;
  TestError *pTVar7;
  allocator_type local_49;
  undefined1 local_48 [8];
  vector<char,_std::allocator<char>_> infoLogBuf;
  int local_28;
  GLenum err;
  GLsizei length;
  GLsizei bufSize;
  GLint value;
  GLuint pipeline_local;
  Functions *gl_local;
  PipelineApiCase *this_local;
  
  bufSize = pipeline;
  _value = gl;
  gl_local = (Functions *)this;
  (*gl->getProgramPipelineiv)(pipeline,0x8b84,&length);
  iVar3 = length + 1;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)local_48,(long)iVar3,&local_49);
  std::allocator<char>::~allocator(&local_49);
  GVar2 = bufSize;
  err = 0;
  p_Var1 = _value->getProgramPipelineInfoLog;
  pvVar6 = std::vector<char,_std::allocator<char>_>::operator[]
                     ((vector<char,_std::allocator<char>_> *)local_48,0);
  (*p_Var1)(GVar2,0,&local_28,pvVar6);
  GVar4 = (*_value->getError)();
  glu::checkError(GVar4,"GetProgramPipelineInfoLog failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                  ,0x370);
  GVar2 = bufSize;
  GVar4 = length / 2;
  p_Var1 = _value->getProgramPipelineInfoLog;
  err = GVar4;
  pvVar6 = std::vector<char,_std::allocator<char>_>::operator[]
                     ((vector<char,_std::allocator<char>_> *)local_48,0);
  (*p_Var1)(GVar2,GVar4,&local_28,pvVar6);
  GVar2 = bufSize;
  if ((err != 0) && (err != local_28 + 1U)) {
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar7,"GetProgramPipelineInfoLog failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
               ,0x376);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  err = length;
  p_Var1 = _value->getProgramPipelineInfoLog;
  pvVar6 = std::vector<char,_std::allocator<char>_>::operator[]
                     ((vector<char,_std::allocator<char>_> *)local_48,0);
  (*p_Var1)(GVar2,length,&local_28,pvVar6);
  GVar4 = err;
  if ((err != 0) && (err != local_28 + 1U)) {
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar7,"GetProgramPipelineInfoLog failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
               ,0x37c);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  p_Var1 = _value->getProgramPipelineInfoLog;
  GVar5 = bufSize + 0x65;
  pvVar6 = std::vector<char,_std::allocator<char>_>::operator[]
                     ((vector<char,_std::allocator<char>_> *)local_48,0);
  (*p_Var1)(GVar5,GVar4,&local_28,pvVar6);
  infoLogBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = (*_value->getError)();
  if (infoLogBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ != 0x501) {
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar7,"GetProgramPipelineInfoLog failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
               ,0x385);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_48)
  ;
  return;
}

Assistant:

void checkProgInfoLog(const glw::Functions& gl, GLuint pipeline)
	{
		glw::GLint   value;
		glw::GLsizei bufSize;
		glw::GLsizei length;
		glw::GLenum  err;

		gl.getProgramPipelineiv(pipeline, GL_INFO_LOG_LENGTH, &value);
		std::vector<char> infoLogBuf(value + 1);

		bufSize = 0;
		gl.getProgramPipelineInfoLog(pipeline, bufSize, &length, &infoLogBuf[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetProgramPipelineInfoLog failed");

		bufSize = value / 2; // read half the log
		gl.getProgramPipelineInfoLog(pipeline, bufSize, &length, &infoLogBuf[0]);
		if ((bufSize != 0) && (bufSize != length + 1))
		{
			TCU_FAIL("GetProgramPipelineInfoLog failed");
		}
		bufSize = value;
		gl.getProgramPipelineInfoLog(pipeline, bufSize, &length, &infoLogBuf[0]);
		if ((bufSize != 0) && (bufSize != length + 1))
		{
			TCU_FAIL("GetProgramPipelineInfoLog failed");
		}

		// Negative case for GetProgramPipelineInfoLog

		gl.getProgramPipelineInfoLog(pipeline + 101, bufSize, &length, &infoLogBuf[0]);
		err = gl.getError();
		if (err != GL_INVALID_VALUE)
		{
			TCU_FAIL("GetProgramPipelineInfoLog failed");
		}
	}